

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

void C_SetCVarsToDefaults(void)

{
  ECVarType local_1c;
  UCVarValue UStack_18;
  ECVarType type;
  UCVarValue val;
  FBaseCVar *cvar;
  
  for (val.pGUID = (GUID *)CVars; val.String != (char *)0x0;
      val = *(UCVarValue *)(val.String + 0x20)) {
    if ((*(uint *)(val.String + 0x10) & 1) != 0) {
      UStack_18.String = (char *)(**(code **)(*(long *)val.String + 0x38))(val.String,&local_1c);
      FBaseCVar::SetGenericRep((FBaseCVar *)val.pGUID,UStack_18,local_1c);
    }
  }
  return;
}

Assistant:

void C_SetCVarsToDefaults (void)
{
	FBaseCVar *cvar = CVars;

	while (cvar)
	{
		// Only default save-able cvars
		if (cvar->Flags & CVAR_ARCHIVE)
		{
			UCVarValue val;
			ECVarType type;
			val = cvar->GetFavoriteRepDefault (&type);
			cvar->SetGenericRep (val, type);
		}
		cvar = cvar->m_Next;
	}
}